

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O3

PublicKey * jbcoin::derivePublicKey(PublicKey *__return_storage_ptr__,KeyType type,SecretKey *sk)

{
  int iVar1;
  secp256k1_context *psVar2;
  string *psVar3;
  string *psVar4;
  char *pcVar5;
  size_t len;
  uchar pubkey [33];
  secp256k1_pubkey pubkey_imp;
  undefined1 local_b1 [57];
  string local_78;
  secp256k1_pubkey local_58;
  
  if (type == ed25519) {
    local_58.data[0] = 0xed;
    ed25519_publickey(sk->buf_,local_58.data + 1);
    local_b1._9_8_ = &local_58;
    psVar4 = (string *)(local_b1 + 9);
    local_b1._17_8_ = 0x21;
LAB_001a8f8b:
    PublicKey::PublicKey(__return_storage_ptr__,(Slice *)psVar4);
    return __return_storage_ptr__;
  }
  if (type == secp256k1) {
    psVar2 = secp256k1Context<void>();
    iVar1 = secp256k1_ec_pubkey_create(psVar2,&local_58,sk->buf_);
    if (iVar1 == 0) {
      pcVar5 = "derivePublicKey: secp256k1_ec_pubkey_create failed";
      psVar4 = (string *)(local_b1 + 9);
      psVar3 = &local_78;
    }
    else {
      local_b1._1_8_ = 0x21;
      psVar2 = secp256k1Context<void>();
      iVar1 = secp256k1_ec_pubkey_serialize
                        (psVar2,local_b1 + 9,(size_t *)(local_b1 + 1),&local_58,0x102);
      if (iVar1 == 1) {
        psVar4 = &local_78;
        local_78._M_string_length = local_b1._1_8_;
        local_78._M_dataplus._M_p = local_b1 + 9;
        goto LAB_001a8f8b;
      }
      pcVar5 = "derivePublicKey: secp256k1_ec_pubkey_serialize failed";
      psVar4 = &local_78;
      psVar3 = (string *)local_b1;
    }
  }
  else {
    pcVar5 = "derivePublicKey: bad key type";
    psVar4 = (string *)&local_58;
    psVar3 = (string *)(local_b1 + 9);
  }
  std::__cxx11::string::string((string *)psVar4,pcVar5,(allocator *)psVar3);
  LogicError(psVar4);
}

Assistant:

PublicKey
derivePublicKey (KeyType type, SecretKey const& sk)
{
    switch(type)
    {
    case KeyType::secp256k1:
    {
        secp256k1_pubkey pubkey_imp;
        if(secp256k1_ec_pubkey_create(
                secp256k1Context(),
                &pubkey_imp,
                reinterpret_cast<unsigned char const*>(
                    sk.data())) != 1)
            LogicError("derivePublicKey: secp256k1_ec_pubkey_create failed");

        unsigned char pubkey[33];
        size_t len = sizeof(pubkey);
        if(secp256k1_ec_pubkey_serialize(
                secp256k1Context(),
                pubkey,
                &len,
                &pubkey_imp,
                SECP256K1_EC_COMPRESSED) != 1)
            LogicError("derivePublicKey: secp256k1_ec_pubkey_serialize failed");

        return PublicKey{Slice{pubkey,
            static_cast<std::size_t>(len)}};
    }
    case KeyType::ed25519:
    {
        unsigned char buf[33];
        buf[0] = 0xED;
        ed25519_publickey(sk.data(), &buf[1]);
        return PublicKey(Slice{ buf, sizeof(buf) });
    }
    default:
        LogicError("derivePublicKey: bad key type");
    };
}